

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::sse2::ConeCurveMiMBIntersector1<4,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  Geometry *pGVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  RTCFilterFunctionN p_Var22;
  byte bVar23;
  long lVar24;
  long lVar25;
  Scene *pSVar26;
  bool bVar27;
  int iVar28;
  RayQueryContext *pRVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  float fVar47;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar59;
  uint uVar60;
  float fVar61;
  uint uVar62;
  float fVar63;
  uint uVar64;
  float fVar65;
  uint uVar66;
  float fVar67;
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar69 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar88;
  float fVar92;
  float fVar93;
  undefined1 auVar89 [16];
  float fVar94;
  undefined1 auVar90 [16];
  uint uVar95;
  undefined1 auVar91 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar99 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar115 [16];
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  Scene *scene;
  RoundLineIntersectorHitM<4> hit;
  int local_31c;
  undefined1 local_318 [12];
  float fStack_30c;
  RayQueryContext *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  undefined8 uStack_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  float local_2a8;
  uint local_2a4;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  RTCFilterFunctionNArguments local_268;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  Primitive *local_1d8;
  Scene *local_1d0;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  uint local_148 [4];
  undefined1 local_138 [16];
  float local_128 [4];
  uint local_118 [4];
  uint local_108 [4];
  uint local_f8 [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  uint local_c8 [4];
  float local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  uStack_2d0 = local_2d8;
  local_1d0 = context->scene;
  uVar31 = line->sharedGeomID;
  uVar32 = (line->v0).field_0.i[0];
  pGVar15 = (local_1d0->geometries).items[uVar31].ptr;
  local_2c8 = pGVar15->fnumTimeSegments;
  fVar35 = (pGVar15->time_range).lower;
  fVar35 = (((ray->dir).field_0.m128[3] - fVar35) / ((pGVar15->time_range).upper - fVar35)) *
           local_2c8;
  _local_318 = ZEXT416((uint)fVar35);
  local_300 = context;
  fVar35 = floorf(fVar35);
  if (local_2c8 + -1.0 <= fVar35) {
    fVar35 = local_2c8 + -1.0;
  }
  fVar76 = 0.0;
  if (0.0 <= fVar35) {
    fVar76 = fVar35;
  }
  fVar35 = (float)local_318._0_4_ - fVar76;
  lVar16 = *(long *)&pGVar15[3].time_range.upper;
  lVar24 = (long)(int)fVar76 * 0x38;
  lVar25 = *(long *)(lVar16 + lVar24);
  lVar17 = *(long *)(lVar16 + 0x10 + lVar24);
  pfVar1 = (float *)(lVar25 + lVar17 * (ulong)uVar32);
  uVar33 = (line->v0).field_0.i[1];
  pfVar2 = (float *)(lVar25 + lVar17 * (ulong)uVar33);
  uVar34 = (line->v0).field_0.i[2];
  pfVar3 = (float *)(lVar25 + lVar17 * (ulong)uVar34);
  uVar95 = (line->v0).field_0.i[3];
  pfVar4 = (float *)(lVar25 + lVar17 * (ulong)uVar95);
  pfVar5 = (float *)(lVar25 + lVar17 * (ulong)(uVar32 + 1));
  pfVar6 = (float *)(lVar25 + lVar17 * (ulong)(uVar33 + 1));
  lVar21 = lVar25 + lVar17 * (ulong)(uVar34 + 1);
  lVar25 = lVar25 + lVar17 * (ulong)(uVar95 + 1);
  lVar17 = *(long *)(lVar16 + 0x38 + lVar24);
  lVar16 = *(long *)(lVar16 + 0x48 + lVar24);
  pfVar7 = (float *)(lVar17 + (ulong)uVar32 * lVar16);
  pfVar8 = (float *)(lVar17 + (ulong)uVar33 * lVar16);
  pfVar9 = (float *)(lVar17 + (ulong)uVar34 * lVar16);
  pfVar10 = (float *)(lVar17 + (ulong)uVar95 * lVar16);
  pfVar11 = (float *)(lVar17 + (ulong)(uVar32 + 1) * lVar16);
  lVar24 = (ulong)(uVar33 + 1) * lVar16;
  pfVar12 = (float *)(lVar17 + (ulong)(uVar34 + 1) * lVar16);
  pfVar13 = (float *)(lVar17 + lVar24);
  pfVar14 = (float *)(lVar17 + lVar16 * (ulong)(uVar95 + 1));
  fVar76 = 1.0 - fVar35;
  fVar96 = *pfVar1 * fVar76 + *pfVar7 * fVar35;
  fVar100 = *pfVar2 * fVar76 + *pfVar8 * fVar35;
  fVar103 = *pfVar3 * fVar76 + *pfVar9 * fVar35;
  fVar107 = *pfVar4 * fVar76 + *pfVar10 * fVar35;
  fVar139 = pfVar1[1] * fVar76 + pfVar7[1] * fVar35;
  fVar141 = pfVar2[1] * fVar76 + pfVar8[1] * fVar35;
  fVar142 = pfVar3[1] * fVar76 + pfVar9[1] * fVar35;
  fVar143 = pfVar4[1] * fVar76 + pfVar10[1] * fVar35;
  fVar97 = pfVar1[2] * fVar76 + pfVar7[2] * fVar35;
  fVar101 = pfVar2[2] * fVar76 + pfVar8[2] * fVar35;
  fVar104 = fStack_2f0 * fVar76 + pfVar9[2] * fVar35;
  fVar108 = fStack_2ec * fVar76 + pfVar10[2] * fVar35;
  fVar67 = pfVar1[3] * fVar76 + pfVar7[3] * fVar35;
  fVar70 = pfVar2[3] * fVar76 + pfVar8[3] * fVar35;
  fVar72 = pfVar3[3] * fVar76 + pfVar9[3] * fVar35;
  fVar74 = pfVar4[3] * fVar76 + pfVar10[3] * fVar35;
  fVar46 = *pfVar5 * fVar76 + *pfVar11 * fVar35;
  fVar53 = *pfVar6 * fVar76 + *pfVar13 * fVar35;
  fVar55 = (float)uStack_2d0 * fVar76 + *pfVar12 * fVar35;
  fVar57 = uStack_2d0._4_4_ * fVar76 + *pfVar14 * fVar35;
  fVar111 = pfVar5[1] * fVar76 + pfVar11[1] * fVar35;
  fVar116 = pfVar6[1] * fVar76 + pfVar13[1] * fVar35;
  fVar120 = *(float *)(lVar21 + 4) * fVar76 + pfVar12[1] * fVar35;
  fVar124 = *(float *)(lVar25 + 4) * fVar76 + pfVar14[1] * fVar35;
  fVar59 = pfVar5[2] * fVar76 + pfVar11[2] * fVar35;
  fVar61 = pfVar6[2] * fVar76 + pfVar13[2] * fVar35;
  fVar63 = fStack_280 * fVar76 + pfVar12[2] * fVar35;
  fVar65 = fStack_27c * fVar76 + pfVar14[2] * fVar35;
  fVar77 = fVar76 * pfVar5[3] + fVar35 * pfVar11[3];
  fVar82 = fVar76 * pfVar6[3] + fVar35 * pfVar13[3];
  fVar84 = fVar76 * *(float *)(lVar21 + 0xc) + fVar35 * pfVar12[3];
  fVar86 = fVar76 * *(float *)(lVar25 + 0xc) + fVar35 * pfVar14[3];
  local_c8[0] = uVar31;
  local_c8[1] = uVar31;
  local_c8[2] = uVar31;
  local_c8[3] = uVar31;
  local_1a8 = (ray->dir).field_0.m128[0];
  fStack_2f0 = (ray->dir).field_0.m128[1];
  auVar89 = *(undefined1 (*) [16])((ray->dir).field_0.m128 + 2);
  local_158 = auVar89._0_4_;
  auVar80._4_12_ = auVar89._4_12_;
  auVar80._0_4_ = local_158 * local_158;
  auVar49._0_4_ = local_1a8 * local_1a8 + fStack_2f0 * fStack_2f0 + auVar80._0_4_;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar89 = rcpps(auVar80,auVar49);
  fVar47 = auVar89._0_4_;
  fVar54 = auVar89._4_4_;
  fVar56 = auVar89._8_4_;
  fVar58 = auVar89._12_4_;
  fVar35 = (ray->org).field_0.m128[1];
  fVar76 = (ray->org).field_0.m128[2];
  fVar132 = (ray->org).field_0.m128[0];
  local_d8 = (((fVar96 + fVar46) * 0.5 - fVar132) * local_1a8 +
             ((fVar139 + fVar111) * 0.5 - fVar35) * fStack_2f0 +
             ((fVar97 + fVar59) * 0.5 - fVar76) * local_158) *
             ((1.0 - auVar49._0_4_ * fVar47) * fVar47 + fVar47);
  fStack_d4 = (((fVar100 + fVar53) * 0.5 - fVar132) * local_1a8 +
              ((fVar141 + fVar116) * 0.5 - fVar35) * fStack_2f0 +
              ((fVar101 + fVar61) * 0.5 - fVar76) * local_158) *
              ((1.0 - auVar49._0_4_ * fVar54) * fVar54 + fVar54);
  fStack_d0 = (((fVar103 + fVar55) * 0.5 - fVar132) * local_1a8 +
              ((fVar142 + fVar120) * 0.5 - fVar35) * fStack_2f0 +
              ((fVar104 + fVar63) * 0.5 - fVar76) * local_158) *
              ((1.0 - auVar49._0_4_ * fVar56) * fVar56 + fVar56);
  fStack_cc = (((fVar107 + fVar57) * 0.5 - fVar132) * local_1a8 +
              ((fVar143 + fVar124) * 0.5 - fVar35) * fStack_2f0 +
              ((fVar108 + fVar65) * 0.5 - fVar76) * local_158) *
              ((1.0 - auVar49._0_4_ * fVar58) * fVar58 + fVar58);
  fVar128 = local_1a8 * local_d8 + fVar132;
  fVar130 = local_1a8 * fStack_d4 + fVar132;
  fVar131 = local_1a8 * fStack_d0 + fVar132;
  fVar132 = local_1a8 * fStack_cc + fVar132;
  fVar133 = fStack_2f0 * local_d8 + fVar35;
  fVar134 = fStack_2f0 * fStack_d4 + fVar35;
  fVar135 = fStack_2f0 * fStack_d0 + fVar35;
  fVar35 = fStack_2f0 * fStack_cc + fVar35;
  fVar136 = local_158 * local_d8 + fVar76;
  fVar137 = local_158 * fStack_d4 + fVar76;
  fVar138 = local_158 * fStack_d0 + fVar76;
  fVar76 = local_158 * fStack_cc + fVar76;
  fVar40 = fVar46 - fVar96;
  fVar43 = fVar53 - fVar100;
  fVar44 = fVar55 - fVar103;
  fVar45 = fVar57 - fVar107;
  fVar96 = fVar128 - fVar96;
  fVar100 = fVar130 - fVar100;
  fVar103 = fVar131 - fVar103;
  fVar107 = fVar132 - fVar107;
  fVar47 = fVar111 - fVar139;
  fVar54 = fVar116 - fVar141;
  fVar56 = fVar120 - fVar142;
  fVar58 = fVar124 - fVar143;
  fVar139 = fVar133 - fVar139;
  fVar141 = fVar134 - fVar141;
  fVar142 = fVar135 - fVar142;
  fVar143 = fVar35 - fVar143;
  fVar112 = fVar59 - fVar97;
  fVar117 = fVar61 - fVar101;
  fVar121 = fVar63 - fVar104;
  fVar125 = fVar65 - fVar108;
  fVar97 = fVar136 - fVar97;
  fVar101 = fVar137 - fVar101;
  fVar104 = fVar138 - fVar104;
  fVar108 = fVar76 - fVar108;
  local_1b8._0_4_ = fVar40 * fVar40 + fVar47 * fVar47 + fVar112 * fVar112;
  local_1b8._4_4_ = fVar43 * fVar43 + fVar54 * fVar54 + fVar117 * fVar117;
  fStack_1b0 = fVar44 * fVar44 + fVar56 * fVar56 + fVar121 * fVar121;
  fStack_1ac = fVar45 * fVar45 + fVar58 * fVar58 + fVar125 * fVar125;
  fVar144 = fVar40 * fVar96 + fVar47 * fVar139 + fVar112 * fVar97;
  fVar145 = fVar43 * fVar100 + fVar54 * fVar141 + fVar117 * fVar101;
  fVar146 = fVar44 * fVar103 + fVar56 * fVar142 + fVar121 * fVar104;
  fVar147 = fVar45 * fVar107 + fVar58 * fVar143 + fVar125 * fVar108;
  auVar140._0_4_ = fVar40 * local_1a8 + fVar47 * fStack_2f0 + fVar112 * local_158;
  auVar140._4_4_ = fVar43 * local_1a8 + fVar54 * fStack_2f0 + fVar117 * local_158;
  auVar140._8_4_ = fVar44 * local_1a8 + fVar56 * fStack_2f0 + fVar121 * local_158;
  auVar140._12_4_ = fVar45 * local_1a8 + fVar58 * fStack_2f0 + fVar125 * local_158;
  _local_2f8 = CONCAT44(fStack_2f0,fStack_2f0);
  fVar68 = fVar67 - fVar77;
  fVar71 = fVar70 - fVar82;
  fVar73 = fVar72 - fVar84;
  fVar75 = fVar74 - fVar86;
  fVar113 = fVar68 * fVar68 + (float)local_1b8._0_4_;
  fVar118 = fVar71 * fVar71 + (float)local_1b8._4_4_;
  fVar122 = fVar73 * fVar73 + fStack_1b0;
  fVar126 = fVar75 * fVar75 + fStack_1ac;
  local_e8 = (float)local_1b8._0_4_ * (float)local_1b8._0_4_;
  fStack_e4 = (float)local_1b8._4_4_ * (float)local_1b8._4_4_;
  fStack_e0 = fStack_1b0 * fStack_1b0;
  fStack_dc = fStack_1ac * fStack_1ac;
  fVar78 = auVar140._0_4_ * auVar140._0_4_;
  fVar83 = auVar140._4_4_ * auVar140._4_4_;
  fVar85 = auVar140._8_4_ * auVar140._8_4_;
  fVar87 = auVar140._12_4_ * auVar140._12_4_;
  auVar89._0_4_ = local_e8 - fVar113 * fVar78;
  auVar89._4_4_ = fStack_e4 - fVar118 * fVar83;
  auVar89._8_4_ = fStack_e0 - fVar122 * fVar85;
  auVar89._12_4_ = fStack_dc - fVar126 * fVar87;
  fVar88 = fVar67 * (float)local_1b8._0_4_;
  fVar92 = fVar70 * (float)local_1b8._4_4_;
  fVar93 = fVar72 * fStack_1b0;
  fVar94 = fVar74 * fStack_1ac;
  fVar98 = fVar68 * auVar140._0_4_ * fVar88 +
           ((local_1a8 * fVar96 + fStack_2f0 * fVar139 + local_158 * fVar97) * local_e8 -
           auVar140._0_4_ * fVar144 * fVar113);
  fVar102 = fVar71 * auVar140._4_4_ * fVar92 +
            ((local_1a8 * fVar100 + fStack_2f0 * fVar141 + local_158 * fVar101) * fStack_e4 -
            auVar140._4_4_ * fVar145 * fVar118);
  fVar105 = fVar73 * auVar140._8_4_ * fVar93 +
            ((local_1a8 * fVar103 + fStack_2f0 * fVar142 + local_158 * fVar104) * fStack_e0 -
            auVar140._8_4_ * fVar146 * fVar122);
  fVar109 = fVar75 * auVar140._12_4_ * fVar94 +
            ((local_1a8 * fVar107 + fStack_2f0 * fVar143 + local_158 * fVar108) * fStack_dc -
            auVar140._12_4_ * fVar147 * fVar126);
  fVar88 = fVar98 * fVar98 -
           (((fVar68 + fVar68) * fVar144 - fVar88) * fVar88 +
           ((fVar96 * fVar96 + fVar139 * fVar139 + fVar97 * fVar97) * local_e8 -
           fVar144 * fVar144 * fVar113)) * auVar89._0_4_;
  fVar92 = fVar102 * fVar102 -
           (((fVar71 + fVar71) * fVar145 - fVar92) * fVar92 +
           ((fVar100 * fVar100 + fVar141 * fVar141 + fVar101 * fVar101) * fStack_e4 -
           fVar145 * fVar145 * fVar118)) * auVar89._4_4_;
  fVar93 = fVar105 * fVar105 -
           (((fVar73 + fVar73) * fVar146 - fVar93) * fVar93 +
           ((fVar103 * fVar103 + fVar142 * fVar142 + fVar104 * fVar104) * fStack_e0 -
           fVar146 * fVar146 * fVar122)) * auVar89._8_4_;
  fVar94 = fVar109 * fVar109 -
           (((fVar75 + fVar75) * fVar147 - fVar94) * fVar94 +
           ((fVar107 * fVar107 + fVar143 * fVar143 + fVar108 * fVar108) * fStack_dc -
           fVar147 * fVar147 * fVar126)) * auVar89._12_4_;
  auVar41._0_4_ = ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) & -(uint)(0.0 <= fVar88);
  auVar41._4_4_ = ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) & -(uint)(0.0 <= fVar92);
  auVar41._8_4_ = ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) & -(uint)(0.0 <= fVar93);
  auVar41._12_4_ = ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) & -(uint)(0.0 <= fVar94);
  lVar21 = (ulong)line->leftExists * 0x10;
  lVar25 = (ulong)line->rightExists * 0x10;
  iVar28 = movmskps((int)lVar24,auVar41);
  if (iVar28 != 0) {
    fVar128 = fVar128 - fVar46;
    fVar130 = fVar130 - fVar53;
    fVar131 = fVar131 - fVar55;
    fVar132 = fVar132 - fVar57;
    auVar48._0_4_ = fVar40 * fVar128;
    auVar48._4_4_ = fVar43 * fVar130;
    auVar48._8_4_ = fVar44 * fVar131;
    auVar48._12_4_ = fVar45 * fVar132;
    fVar133 = fVar133 - fVar111;
    fVar134 = fVar134 - fVar116;
    fVar135 = fVar135 - fVar120;
    fVar35 = fVar35 - fVar124;
    auVar79._0_4_ = fVar47 * fVar133;
    auVar79._4_4_ = fVar54 * fVar134;
    auVar79._8_4_ = fVar56 * fVar135;
    auVar79._12_4_ = fVar58 * fVar35;
    fVar136 = fVar136 - fVar59;
    fVar137 = fVar137 - fVar61;
    fVar138 = fVar138 - fVar63;
    fVar76 = fVar76 - fVar65;
    fVar111 = fVar112 * fVar136 + auVar79._0_4_ + auVar48._0_4_;
    fVar116 = fVar117 * fVar137 + auVar79._4_4_ + auVar48._4_4_;
    fVar120 = fVar121 * fVar138 + auVar79._8_4_ + auVar48._8_4_;
    fVar124 = fVar125 * fVar76 + auVar79._12_4_ + auVar48._12_4_;
    auVar20._4_4_ = fVar92;
    auVar20._0_4_ = fVar88;
    auVar20._8_4_ = fVar93;
    auVar20._12_4_ = fVar94;
    auVar80 = sqrtps(auVar79,auVar20);
    auVar49 = rcpps(auVar48,auVar89);
    fVar46 = auVar49._0_4_;
    fVar53 = auVar49._4_4_;
    fVar55 = auVar49._8_4_;
    fVar57 = auVar49._12_4_;
    fVar46 = (1.0 - auVar89._0_4_ * fVar46) * fVar46 + fVar46;
    fVar53 = (1.0 - auVar89._4_4_ * fVar53) * fVar53 + fVar53;
    fVar55 = (1.0 - auVar89._8_4_ * fVar55) * fVar55 + fVar55;
    fVar57 = (1.0 - auVar89._12_4_ * fVar57) * fVar57 + fVar57;
    uVar31 = -(uint)(1e-18 < ABS(auVar89._0_4_));
    uVar32 = -(uint)(1e-18 < ABS(auVar89._4_4_));
    uVar33 = -(uint)(1e-18 < ABS(auVar89._8_4_));
    uVar34 = -(uint)(1e-18 < ABS(auVar89._12_4_));
    fVar59 = (float)(~uVar31 & 0xff800000 | (uint)((-fVar98 - auVar80._0_4_) * fVar46) & uVar31);
    fVar61 = (float)(~uVar32 & 0xff800000 | (uint)((-fVar102 - auVar80._4_4_) * fVar53) & uVar32);
    fVar63 = (float)(~uVar33 & 0xff800000 | (uint)((-fVar105 - auVar80._8_4_) * fVar55) & uVar33);
    fVar65 = (float)(~uVar34 & 0xff800000 | (uint)((-fVar109 - auVar80._12_4_) * fVar57) & uVar34);
    fVar46 = (float)(~uVar31 & 0x7f800000 | (uint)((auVar80._0_4_ - fVar98) * fVar46) & uVar31);
    fVar53 = (float)(~uVar32 & 0x7f800000 | (uint)((auVar80._4_4_ - fVar102) * fVar53) & uVar32);
    fVar55 = (float)(~uVar33 & 0x7f800000 | (uint)((auVar80._8_4_ - fVar105) * fVar55) & uVar33);
    fVar57 = (float)(~uVar34 & 0x7f800000 | (uint)((auVar80._12_4_ - fVar109) * fVar57) & uVar34);
    fVar93 = auVar140._0_4_ * fVar59 + fVar144;
    fVar94 = auVar140._4_4_ * fVar61 + fVar145;
    fVar98 = auVar140._8_4_ * fVar63 + fVar146;
    fVar102 = auVar140._12_4_ * fVar65 + fVar147;
    uVar31 = -(uint)(0.0 < fVar93 && fVar93 < (float)local_1b8._0_4_) & auVar41._0_4_;
    uVar32 = -(uint)(0.0 < fVar94 && fVar94 < (float)local_1b8._4_4_) & auVar41._4_4_;
    uVar33 = -(uint)(0.0 < fVar98 && fVar98 < fStack_1b0) & auVar41._8_4_;
    uVar34 = -(uint)(0.0 < fVar102 && fVar102 < fStack_1ac) & auVar41._12_4_;
    auVar115._0_4_ = (uint)fVar59 & uVar31;
    auVar115._4_4_ = (uint)fVar61 & uVar32;
    auVar115._8_4_ = (uint)fVar63 & uVar33;
    auVar115._12_4_ = (uint)fVar65 & uVar34;
    auVar81._0_8_ = CONCAT44(~uVar32,~uVar31) & 0x7f8000007f800000;
    auVar81._8_4_ = ~uVar33 & 0x7f800000;
    auVar81._12_4_ = ~uVar34 & 0x7f800000;
    auVar81 = auVar81 | auVar115;
    fVar88 = auVar140._0_4_ * fVar46 + fVar144;
    fVar92 = auVar140._4_4_ * fVar53 + fVar145;
    fStack_280 = auVar140._8_4_ * fVar55 + fVar146;
    fStack_27c = auVar140._12_4_ * fVar57 + fVar147;
    auVar50._4_4_ = -(uint)(0.0 < fVar92);
    auVar50._0_4_ = -(uint)(0.0 < fVar88);
    auVar50._8_4_ = -(uint)(0.0 < fStack_280);
    auVar50._12_4_ = -(uint)(0.0 < fStack_27c);
    _local_288 = CONCAT44(fVar92,fVar88);
    uVar31 = -(uint)(fVar88 < (float)local_1b8._0_4_ && 0.0 < fVar88) & auVar41._0_4_;
    uVar32 = -(uint)(fVar92 < (float)local_1b8._4_4_ && 0.0 < fVar92) & auVar41._4_4_;
    uVar33 = -(uint)(fStack_280 < fStack_1b0 && 0.0 < fStack_280) & auVar41._8_4_;
    uVar34 = -(uint)(fStack_27c < fStack_1ac && 0.0 < fStack_27c) & auVar41._12_4_;
    auVar36._0_4_ = (uint)fVar46 & uVar31;
    auVar36._4_4_ = (uint)fVar53 & uVar32;
    auVar36._8_4_ = (uint)fVar55 & uVar33;
    auVar36._12_4_ = (uint)fVar57 & uVar34;
    auVar69._0_8_ = CONCAT44(~uVar32,~uVar31) & 0xff800000ff800000;
    auVar69._8_4_ = ~uVar33 & 0xff800000;
    auVar69._12_4_ = ~uVar34 & 0xff800000;
    _local_1c8 = auVar69 | auVar36;
    auVar89 = rcpps(auVar50,auVar140);
    fVar46 = auVar89._0_4_;
    fVar53 = auVar89._4_4_;
    fVar55 = auVar89._8_4_;
    fVar57 = auVar89._12_4_;
    fVar46 = (1.0 - auVar140._0_4_ * fVar46) * fVar46 + fVar46;
    fVar53 = (1.0 - auVar140._4_4_ * fVar53) * fVar53 + fVar53;
    fVar55 = (1.0 - auVar140._8_4_ * fVar55) * fVar55 + fVar55;
    fVar57 = (1.0 - auVar140._12_4_ * fVar57) * fVar57 + fVar57;
    fVar105 = auVar140._0_4_ * fVar96 - local_1a8 * fVar144;
    fVar109 = auVar140._4_4_ * fVar100 - local_1a8 * fVar145;
    fVar106 = auVar140._8_4_ * fVar103 - local_1a8 * fVar146;
    fVar110 = auVar140._12_4_ * fVar107 - local_1a8 * fVar147;
    fVar59 = auVar140._0_4_ * fVar139 - fStack_2f0 * fVar144;
    fVar61 = auVar140._4_4_ * fVar141 - fStack_2f0 * fVar145;
    fVar63 = auVar140._8_4_ * fVar142 - fStack_2f0 * fVar146;
    fVar65 = auVar140._12_4_ * fVar143 - fStack_2f0 * fVar147;
    fVar114 = auVar140._0_4_ * fVar97 - local_158 * fVar144;
    fVar119 = auVar140._4_4_ * fVar101 - local_158 * fVar145;
    fVar123 = auVar140._8_4_ * fVar104 - local_158 * fVar146;
    fVar127 = auVar140._12_4_ * fVar108 - local_158 * fVar147;
    uVar31 = -(uint)(fVar67 * fVar67 * fVar78 <=
                    fVar105 * fVar105 + fVar59 * fVar59 + fVar114 * fVar114);
    uVar32 = -(uint)(fVar70 * fVar70 * fVar83 <=
                    fVar109 * fVar109 + fVar61 * fVar61 + fVar119 * fVar119);
    uVar33 = -(uint)(fVar72 * fVar72 * fVar85 <=
                    fVar106 * fVar106 + fVar63 * fVar63 + fVar123 * fVar123);
    uVar34 = -(uint)(fVar74 * fVar74 * fVar87 <=
                    fVar110 * fVar110 + fVar65 * fVar65 + fVar127 * fVar127);
    local_2d8._0_4_ = (undefined4)*(undefined8 *)(mm_lookupmask_ps + lVar21);
    local_2d8._4_4_ = (undefined4)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar21) >> 0x20);
    uStack_2d0._0_4_ = (float)*(undefined8 *)(mm_lookupmask_ps + lVar21 + 8);
    uStack_2d0._4_4_ = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar21 + 8) >> 0x20);
    auVar99._0_4_ =
         (uVar31 & 0x7f800000 | ~uVar31 & (uint)(-fVar144 * fVar46)) &
         ~local_2d8._0_4_ & auVar41._0_4_;
    auVar99._4_4_ =
         (uVar32 & 0x7f800000 | ~uVar32 & (uint)(-fVar145 * fVar53)) &
         ~local_2d8._4_4_ & auVar41._4_4_;
    auVar99._8_4_ =
         (uVar33 & 0x7f800000 | ~uVar33 & (uint)(-fVar146 * fVar55)) &
         ~(uint)(float)uStack_2d0 & auVar41._8_4_;
    auVar99._12_4_ =
         (uVar34 & 0x7f800000 | ~uVar34 & (uint)(-fVar147 * fVar57)) &
         ~(uint)uStack_2d0._4_4_ & auVar41._12_4_;
    auVar51._0_8_ =
         CONCAT44(~(~local_2d8._4_4_ & auVar41._4_4_),~(~local_2d8._0_4_ & auVar41._0_4_)) &
         0x7f8000007f800000;
    auVar51._8_4_ = ~(~(uint)(float)uStack_2d0 & auVar41._8_4_) & 0x7f800000;
    auVar51._12_4_ = ~(~(uint)uStack_2d0._4_4_ & auVar41._12_4_) & 0x7f800000;
    _local_2d8 = auVar51 | auVar99;
    fVar59 = fVar128 * auVar140._0_4_ - local_1a8 * fVar111;
    fVar61 = fVar130 * auVar140._4_4_ - local_1a8 * fVar116;
    fVar63 = fVar131 * auVar140._8_4_ - local_1a8 * fVar120;
    fVar65 = fVar132 * auVar140._12_4_ - local_1a8 * fVar124;
    fVar132 = fVar133 * auVar140._0_4_ - fStack_2f0 * fVar111;
    fVar133 = fVar134 * auVar140._4_4_ - fStack_2f0 * fVar116;
    fVar134 = fVar135 * auVar140._8_4_ - fStack_2f0 * fVar120;
    fVar135 = fVar35 * auVar140._12_4_ - fStack_2f0 * fVar124;
    fVar105 = fVar136 * auVar140._0_4_ - local_158 * fVar111;
    fVar109 = fVar137 * auVar140._4_4_ - local_158 * fVar116;
    fVar128 = fVar138 * auVar140._8_4_ - local_158 * fVar120;
    fVar76 = fVar76 * auVar140._12_4_ - local_158 * fVar124;
    fVar35 = (ray->org).field_0.m128[3];
    local_188 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar25);
    fStack_184 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar25) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar25 + 8);
    fStack_17c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar25 + 8) >> 0x20);
    uVar31 = -(uint)(fVar77 * fVar77 * fVar78 <=
                    fVar59 * fVar59 + fVar132 * fVar132 + fVar105 * fVar105);
    uVar32 = -(uint)(fVar82 * fVar82 * fVar83 <=
                    fVar61 * fVar61 + fVar133 * fVar133 + fVar109 * fVar109);
    uVar33 = -(uint)(fVar84 * fVar84 * fVar85 <=
                    fVar63 * fVar63 + fVar134 * fVar134 + fVar128 * fVar128);
    uVar34 = -(uint)(fVar86 * fVar86 * fVar87 <=
                    fVar65 * fVar65 + fVar135 * fVar135 + fVar76 * fVar76);
    auVar129._0_4_ =
         (uVar31 & 0x7f800000 | ~uVar31 & (uint)(-fVar111 * fVar46)) &
         ~(uint)local_188 & auVar41._0_4_;
    auVar129._4_4_ =
         (uVar32 & 0x7f800000 | ~uVar32 & (uint)(-fVar116 * fVar53)) &
         ~(uint)fStack_184 & auVar41._4_4_;
    auVar129._8_4_ =
         (uVar33 & 0x7f800000 | ~uVar33 & (uint)(-fVar120 * fVar55)) &
         ~(uint)fStack_180 & auVar41._8_4_;
    auVar129._12_4_ =
         (uVar34 & 0x7f800000 | ~uVar34 & (uint)(-fVar124 * fVar57)) &
         ~(uint)fStack_17c & auVar41._12_4_;
    auVar42._0_8_ =
         CONCAT44(~(~(uint)fStack_184 & auVar41._4_4_),~(~(uint)local_188 & auVar41._0_4_)) &
         0x7f8000007f800000;
    auVar42._8_4_ = ~(~(uint)fStack_180 & auVar41._8_4_) & 0x7f800000;
    auVar42._12_4_ = ~(~(uint)fStack_17c & auVar41._12_4_) & 0x7f800000;
    auVar89 = minps(_local_2d8,auVar42 | auVar129);
    auVar49 = maxps(_local_2d8,auVar42 | auVar129);
    auVar80 = minps(auVar81,auVar89);
    fVar57 = auVar80._0_4_;
    fVar59 = auVar80._4_4_;
    fVar61 = auVar80._8_4_;
    fVar63 = auVar80._12_4_;
    fVar76 = auVar89._0_4_;
    fVar132 = auVar89._4_4_;
    fVar133 = auVar89._8_4_;
    fVar134 = auVar89._12_4_;
    uVar31 = -(uint)(auVar49._0_4_ != INFINITY);
    uVar32 = -(uint)(auVar49._4_4_ != INFINITY);
    uVar33 = -(uint)(auVar49._8_4_ != INFINITY);
    uVar34 = -(uint)(auVar49._12_4_ != INFINITY);
    auVar52._0_4_ =
         (~-(uint)(fVar76 != INFINITY) & 0xff800000 | (uint)fVar76 & -(uint)(fVar76 != INFINITY)) &
         -(uint)(fVar57 != fVar76);
    auVar52._4_4_ =
         (~-(uint)(fVar132 != INFINITY) & 0xff800000 | (uint)fVar132 & -(uint)(fVar132 != INFINITY))
         & -(uint)(fVar59 != fVar132);
    auVar52._8_4_ =
         (~-(uint)(fVar133 != INFINITY) & 0xff800000 | (uint)fVar133 & -(uint)(fVar133 != INFINITY))
         & -(uint)(fVar61 != fVar133);
    auVar52._12_4_ =
         (~-(uint)(fVar134 != INFINITY) & 0xff800000 | (uint)fVar134 & -(uint)(fVar134 != INFINITY))
         & -(uint)(fVar63 != fVar134);
    auVar90._0_4_ =
         ~-(uint)(fVar57 != fVar76) & (~uVar31 & 0xff800000 | (uint)auVar49._0_4_ & uVar31);
    auVar90._4_4_ =
         ~-(uint)(fVar59 != fVar132) & (~uVar32 & 0xff800000 | (uint)auVar49._4_4_ & uVar32);
    auVar90._8_4_ =
         ~-(uint)(fVar61 != fVar133) & (~uVar33 & 0xff800000 | (uint)auVar49._8_4_ & uVar33);
    auVar90._12_4_ =
         ~-(uint)(fVar63 != fVar134) & (~uVar34 & 0xff800000 | (uint)auVar49._12_4_ & uVar34);
    _local_48 = maxps(_local_1c8,auVar90 | auVar52);
    local_b8 = ray->tfar;
    iStack_b4 = ray->mask;
    iStack_b0 = ray->id;
    iStack_ac = ray->flags;
    local_178 = -(uint)((fVar35 <= local_d8 + fVar57 && local_d8 + fVar57 <= local_b8) &&
                       fVar57 != INFINITY);
    uStack_174 = -(uint)((fVar35 <= fStack_d4 + fVar59 && fStack_d4 + fVar59 <= local_b8) &&
                        fVar59 != INFINITY);
    uStack_170 = -(uint)((fVar35 <= fStack_d0 + fVar61 && fStack_d0 + fVar61 <= local_b8) &&
                        fVar61 != INFINITY);
    uStack_16c = -(uint)((fVar35 <= fStack_cc + fVar63 && fStack_cc + fVar63 <= local_b8) &&
                        fVar63 != INFINITY);
    fVar135 = local_48._0_4_;
    fVar76 = local_d8 + fVar135;
    fVar46 = local_48._4_4_;
    fVar132 = fStack_d4 + fVar46;
    fVar53 = local_48._8_4_;
    fVar133 = fStack_d0 + fVar53;
    fVar55 = local_48._12_4_;
    fVar134 = fStack_cc + fVar55;
    uVar32 = local_178 & auVar41._0_4_;
    uVar33 = uStack_174 & auVar41._4_4_;
    auVar37._4_4_ = uVar33;
    auVar37._0_4_ = uVar32;
    uVar34 = uStack_170 & auVar41._8_4_;
    uVar95 = uStack_16c & auVar41._12_4_;
    local_228 = -(uint)(fVar135 != -INFINITY) & auVar41._0_4_ &
                -(uint)(fVar76 <= local_b8 && fVar35 <= fVar76);
    uStack_224 = -(uint)(fVar46 != -INFINITY) & auVar41._4_4_ &
                 -(uint)(fVar132 <= local_b8 && fVar35 <= fVar132);
    uStack_220 = -(uint)(fVar53 != -INFINITY) & auVar41._8_4_ &
                 -(uint)(fVar133 <= local_b8 && fVar35 <= fVar133);
    uStack_21c = -(uint)(fVar55 != -INFINITY) & auVar41._12_4_ &
                 -(uint)(fVar134 <= local_b8 && fVar35 <= fVar134);
    auVar37._8_4_ = uVar34;
    auVar37._12_4_ = uVar95;
    auVar19._4_4_ = uStack_224;
    auVar19._0_4_ = local_228;
    auVar19._8_4_ = uStack_220;
    auVar19._12_4_ = uStack_21c;
    uVar31 = movmskps((int)lVar21,auVar37 | auVar19);
    if (uVar31 != 0) {
      _local_188 = CONCAT44(fVar132,fVar76);
      _fStack_180 = CONCAT44(fVar134,fVar133);
      fVar134 = (float)((uint)fVar57 & uVar32 | ~uVar32 & (uint)fVar135);
      fVar135 = (float)((uint)fVar59 & uVar33 | ~uVar33 & (uint)fVar46);
      fVar46 = (float)((uint)fVar61 & uVar34 | ~uVar34 & (uint)fVar53);
      fVar53 = (float)((uint)fVar63 & uVar95 | ~uVar95 & (uint)fVar55);
      auVar38._0_4_ = (uint)fVar93 & uVar32;
      auVar38._4_4_ = (uint)fVar94 & uVar33;
      auVar38._8_4_ = (uint)fVar98 & uVar34;
      auVar38._12_4_ = (uint)fVar102 & uVar95;
      auVar91._0_4_ = ~uVar32 & (uint)fVar88;
      auVar91._4_4_ = ~uVar33 & (uint)fVar92;
      auVar91._8_4_ = ~uVar34 & (uint)fStack_280;
      auVar91._12_4_ = ~uVar95 & (uint)fStack_27c;
      auVar91 = auVar91 | auVar38;
      auVar89 = rcpps(auVar38,_local_1b8);
      local_238 = auVar89._0_4_;
      fStack_234 = auVar89._4_4_;
      fStack_230 = auVar89._8_4_;
      fStack_22c = auVar89._12_4_;
      local_238 = (1.0 - (float)local_1b8._0_4_ * local_238) * local_238 + local_238;
      fStack_234 = (1.0 - (float)local_1b8._4_4_ * fStack_234) * fStack_234 + fStack_234;
      fStack_230 = (1.0 - fStack_1b0 * fStack_230) * fStack_230 + fStack_230;
      fStack_22c = (1.0 - fStack_1ac * fStack_22c) * fStack_22c + fStack_22c;
      fVar67 = fVar67 * fVar68 * (float)local_1b8._0_4_;
      fVar70 = fVar70 * fVar71 * (float)local_1b8._4_4_;
      fVar72 = fVar72 * fVar73 * fStack_1b0;
      fVar74 = fVar74 * fVar75 * fStack_1ac;
      local_198 = fVar47 * fVar67;
      fStack_194 = fVar54 * fVar70;
      fStack_190 = fVar56 * fVar72;
      fStack_18c = fVar58 * fVar74;
      local_2c8 = fVar67 * fVar112;
      fStack_2c4 = fVar70 * fVar117;
      fStack_2c0 = fVar72 * fVar121;
      fStack_2bc = fVar74 * fVar125;
      local_168 = fVar113 * fVar112;
      fStack_164 = fVar118 * fVar117;
      fStack_160 = fVar122 * fVar121;
      fStack_15c = fVar126 * fVar125;
      uVar32 = -(uint)(fVar134 == (float)local_1c8._0_4_ || fVar134 == auVar81._0_4_) &
               auVar41._0_4_;
      uVar33 = -(uint)(fVar135 == (float)local_1c8._4_4_ || fVar135 == auVar81._4_4_) &
               auVar41._4_4_;
      uVar34 = -(uint)(fVar46 == fStack_1c0 || fVar46 == auVar81._8_4_) & auVar41._8_4_;
      uVar95 = -(uint)(fVar53 == fStack_1bc || fVar53 == auVar81._12_4_) & auVar41._12_4_;
      uVar60 = -(uint)(fVar134 == local_2d8._0_4_) & auVar41._0_4_;
      uVar62 = -(uint)(fVar135 == local_2d8._4_4_) & auVar41._4_4_;
      uVar64 = -(uint)(fVar46 == local_2d8._8_4_) & auVar41._8_4_;
      uVar66 = -(uint)(fVar53 == local_2d8._12_4_) & auVar41._12_4_;
      local_68 = fVar40 * fVar67;
      fStack_64 = fVar43 * fVar70;
      fStack_60 = fVar44 * fVar72;
      fStack_5c = fVar45 * fVar74;
      local_88 = fVar40 * fVar113;
      fStack_84 = fVar43 * fVar118;
      fStack_80 = fVar44 * fVar122;
      fStack_7c = fVar45 * fVar126;
      fVar35 = auVar91._0_4_;
      fVar76 = auVar91._4_4_;
      fVar132 = auVar91._8_4_;
      fVar133 = auVar91._12_4_;
      local_78 = fVar47 * fVar113;
      fStack_74 = fVar54 * fVar118;
      fStack_70 = fVar56 * fVar122;
      fStack_6c = fVar58 * fVar126;
      local_98 = -fVar40;
      fStack_94 = -fVar43;
      fStack_90 = -fVar44;
      fStack_8c = -fVar45;
      local_a8 = -fVar47;
      fStack_a4 = -fVar54;
      fStack_a0 = -fVar56;
      fStack_9c = -fVar58;
      local_318._0_8_ = CONCAT44(fVar117,fVar112) ^ 0x8000000080000000;
      local_318._8_4_ = -fVar121;
      fStack_30c = -fVar125;
      local_58 = ~uVar60 & 0x3f800000;
      uStack_54 = ~uVar62 & 0x3f800000;
      uStack_50 = ~uVar64 & 0x3f800000;
      uStack_4c = ~uVar66 & 0x3f800000;
      local_148[0] = ~uVar32 & ~uVar60 & 0x3f800000 | (uint)(fVar35 * local_238) & uVar32;
      local_148[1] = ~uVar33 & ~uVar62 & 0x3f800000 | (uint)(fVar76 * fStack_234) & uVar33;
      local_148[2] = ~uVar34 & ~uVar64 & 0x3f800000 | (uint)(fVar132 * fStack_230) & uVar34;
      local_148[3] = ~uVar95 & ~uVar66 & 0x3f800000 | (uint)(fVar133 * fStack_22c) & uVar95;
      local_138._0_12_ = ZEXT812(0);
      local_138._12_4_ = 0;
      local_128[0] = local_d8 + fVar134;
      local_128[1] = fStack_d4 + fVar135;
      local_128[2] = fStack_d0 + fVar46;
      local_128[3] = fStack_cc + fVar53;
      local_118[0] = (uint)(((local_1a8 * fVar134 + fVar96) * local_e8 + fVar40 * fVar67) -
                           fVar40 * fVar113 * fVar35) & uVar32 |
                     ~uVar32 & ((uint)-fVar40 & uVar60 | ~uVar60 & (uint)fVar40);
      local_118[1] = (uint)(((local_1a8 * fVar135 + fVar100) * fStack_e4 + fVar43 * fVar70) -
                           fVar43 * fVar118 * fVar76) & uVar33 |
                     ~uVar33 & ((uint)-fVar43 & uVar62 | ~uVar62 & (uint)fVar43);
      local_118[2] = (uint)(((local_1a8 * fVar46 + fVar103) * fStack_e0 + fVar44 * fVar72) -
                           fVar44 * fVar122 * fVar132) & uVar34 |
                     ~uVar34 & ((uint)-fVar44 & uVar64 | ~uVar64 & (uint)fVar44);
      local_118[3] = (uint)(((local_1a8 * fVar53 + fVar107) * fStack_dc + fVar45 * fVar74) -
                           fVar45 * fVar126 * fVar133) & uVar95 |
                     ~uVar95 & ((uint)-fVar45 & uVar66 | ~uVar66 & (uint)fVar45);
      local_108[0] = (uint)(((fStack_2f0 * fVar134 + fVar139) * local_e8 + local_198) -
                           fVar47 * fVar113 * fVar35) & uVar32 |
                     ~uVar32 & ((uint)-fVar47 & uVar60 | ~uVar60 & (uint)fVar47);
      local_108[1] = (uint)(((fStack_2f0 * fVar135 + fVar141) * fStack_e4 + fStack_194) -
                           fVar54 * fVar118 * fVar76) & uVar33 |
                     ~uVar33 & ((uint)-fVar54 & uVar62 | ~uVar62 & (uint)fVar54);
      local_108[2] = (uint)(((fStack_2f0 * fVar46 + fVar142) * fStack_e0 + fStack_190) -
                           fVar56 * fVar122 * fVar132) & uVar34 |
                     ~uVar34 & ((uint)-fVar56 & uVar64 | ~uVar64 & (uint)fVar56);
      local_108[3] = (uint)(((fStack_2f0 * fVar53 + fVar143) * fStack_dc + fStack_18c) -
                           fVar58 * fVar126 * fVar133) & uVar95 |
                     ~uVar95 & ((uint)-fVar58 & uVar66 | ~uVar66 & (uint)fVar58);
      local_f8[0] = (uint)(((local_158 * fVar134 + fVar97) * local_e8 + local_2c8) -
                          local_168 * fVar35) & uVar32 |
                    ~uVar32 & ((uint)-fVar112 & uVar60 | ~uVar60 & (uint)fVar112);
      local_f8[1] = (uint)(((local_158 * fVar135 + fVar101) * fStack_e4 + fStack_2c4) -
                          fStack_164 * fVar76) & uVar33 |
                    ~uVar33 & ((uint)-fVar117 & uVar62 | ~uVar62 & (uint)fVar117);
      local_f8[2] = (uint)(((local_158 * fVar46 + fVar104) * fStack_e0 + fStack_2c0) -
                          fStack_160 * fVar132) & uVar34 |
                    ~uVar34 & ((uint)-fVar121 & uVar64 | ~uVar64 & (uint)fVar121);
      local_f8[3] = (uint)(((local_158 * fVar53 + fVar108) * fStack_dc + fStack_2bc) -
                          fStack_15c * fVar133) & uVar95 |
                    ~uVar95 & ((uint)-fVar125 & uVar66 | ~uVar66 & (uint)fVar125);
      uVar30 = (ulong)(uVar31 & 0xff);
      pSVar26 = local_1d0;
      pRVar29 = local_300;
      fStack_2ec = fStack_2f0;
      local_2e8 = fVar47;
      fStack_2e4 = fVar54;
      fStack_2e0 = fVar56;
      fStack_2dc = fVar58;
      local_278 = fVar40;
      fStack_274 = fVar43;
      fStack_270 = fVar44;
      fStack_26c = fVar45;
      local_218 = fVar97;
      fStack_214 = fVar101;
      fStack_210 = fVar104;
      fStack_20c = fVar108;
      local_208 = fVar139;
      fStack_204 = fVar141;
      fStack_200 = fVar142;
      fStack_1fc = fVar143;
      local_1f8 = fVar96;
      fStack_1f4 = fVar100;
      fStack_1f0 = fVar103;
      fStack_1ec = fVar107;
      local_1e8 = fVar112;
      fStack_1e4 = fVar117;
      fStack_1e0 = fVar121;
      fStack_1dc = fVar125;
      local_1d8 = line;
      _local_1b8 = auVar81;
      fStack_1a4 = local_1a8;
      fStack_1a0 = local_1a8;
      fStack_19c = local_1a8;
      fStack_154 = local_158;
      fStack_150 = local_158;
      fStack_14c = local_158;
      do {
        local_268.hit = (RTCHitN *)&local_2b8;
        local_268.valid = &local_31c;
        uVar18 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        local_2a0 = local_c8[uVar18];
        pGVar15 = (pSVar26->geometries).items[local_2a0].ptr;
        local_268.ray = (RTCRayN *)ray;
        if ((pGVar15->mask & ray->mask) != 0) {
          if ((pRVar29->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar27 = true, pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0034663b;
          local_2ac = local_148[uVar18];
          local_2a8 = local_128[uVar18 - 4];
          local_2a4 = (local_1d8->primIDs).field_0.i[uVar18];
          local_2b8 = local_118[uVar18];
          local_2b4 = local_108[uVar18];
          local_2b0 = local_f8[uVar18];
          local_29c = pRVar29->user->instID[0];
          local_298 = pRVar29->user->instPrimID[0];
          ray->tfar = local_128[uVar18];
          local_31c = -1;
          local_268.geometryUserPtr = pGVar15->userPtr;
          local_268.context = pRVar29->user;
          local_268.N = 1;
          if ((pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar15->occlusionFilterN)(&local_268), pRVar29 = local_300, *local_268.valid != 0))
          {
            p_Var22 = pRVar29->args->filter;
            if ((p_Var22 == (RTCFilterFunctionN)0x0) ||
               ((((pRVar29->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar15->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var22)(&local_268), p_Var22 = (RTCFilterFunctionN)local_268.valid,
                pRVar29 = local_300, *local_268.valid != 0)))) {
              local_2a0 = (uint)p_Var22;
              bVar27 = true;
              fVar47 = local_2e8;
              fVar54 = fStack_2e4;
              fVar56 = fStack_2e0;
              fVar58 = fStack_2dc;
              fVar112 = local_1e8;
              fVar117 = fStack_1e4;
              fVar121 = fStack_1e0;
              fVar125 = fStack_1dc;
              fVar40 = local_278;
              fVar43 = fStack_274;
              fVar44 = fStack_270;
              fVar45 = fStack_26c;
              fVar96 = local_1f8;
              fVar100 = fStack_1f4;
              fVar103 = fStack_1f0;
              fVar107 = fStack_1ec;
              fVar139 = local_208;
              fVar141 = fStack_204;
              fVar142 = fStack_200;
              fVar143 = fStack_1fc;
              fVar97 = local_218;
              fVar101 = fStack_214;
              fVar104 = fStack_210;
              fVar108 = fStack_20c;
              goto LAB_0034663b;
            }
          }
          local_2a0 = (uint)local_268.valid;
          ray->tfar = local_b8;
          pSVar26 = local_1d0;
          pRVar29 = local_300;
          fVar47 = local_2e8;
          fVar54 = fStack_2e4;
          fVar56 = fStack_2e0;
          fVar58 = fStack_2dc;
          fVar112 = local_1e8;
          fVar117 = fStack_1e4;
          fVar121 = fStack_1e0;
          fVar125 = fStack_1dc;
          fVar40 = local_278;
          fVar43 = fStack_274;
          fVar44 = fStack_270;
          fVar45 = fStack_26c;
          fVar96 = local_1f8;
          fVar100 = fStack_1f4;
          fVar103 = fStack_1f0;
          fVar107 = fStack_1ec;
          fVar139 = local_208;
          fVar141 = fStack_204;
          fVar142 = fStack_200;
          fVar143 = fStack_1fc;
          fVar97 = local_218;
          fVar101 = fStack_214;
          fVar104 = fStack_210;
          fVar108 = fStack_20c;
        }
        uVar30 = uVar30 ^ 1L << (uVar18 & 0x3f);
      } while (uVar30 != 0);
      bVar27 = false;
LAB_0034663b:
      fVar35 = ray->tfar;
      auVar39._0_4_ = local_178 & local_228 & -(uint)(local_188 <= fVar35);
      auVar39._4_4_ = uStack_174 & uStack_224 & -(uint)(fStack_184 <= fVar35);
      auVar39._8_4_ = uStack_170 & uStack_220 & -(uint)(fStack_180 <= fVar35);
      auVar39._12_4_ = uStack_16c & uStack_21c & -(uint)(fStack_17c <= fVar35);
      uVar31 = movmskps(local_2a0,auVar39);
      if (uVar31 == 0) {
        return bVar27;
      }
      uVar60 = -(uint)((float)local_1b8._0_4_ != (float)local_48._0_4_ &&
                      (float)local_1c8._0_4_ != (float)local_48._0_4_);
      uVar62 = -(uint)((float)local_1b8._4_4_ != (float)local_48._4_4_ &&
                      (float)local_1c8._4_4_ != (float)local_48._4_4_);
      uVar64 = -(uint)(fStack_1b0 != fStack_40 && fStack_1c0 != fStack_40);
      uVar66 = -(uint)(fStack_1ac != fStack_3c && fStack_1bc != fStack_3c);
      uVar32 = -(uint)((float)local_2d8._0_4_ != (float)local_48._0_4_);
      uVar33 = -(uint)((float)local_2d8._4_4_ != (float)local_48._4_4_);
      uVar34 = -(uint)((float)uStack_2d0 != fStack_40);
      uVar95 = -(uint)(uStack_2d0._4_4_ != fStack_3c);
      local_148[0] = ~uVar60 & (uint)(local_238 * local_288) | local_58 & uVar60;
      local_148[1] = ~uVar62 & (uint)(fStack_234 * fStack_284) | uStack_54 & uVar62;
      local_148[2] = ~uVar64 & (uint)(fStack_230 * fStack_280) | uStack_50 & uVar64;
      local_148[3] = ~uVar66 & (uint)(fStack_22c * fStack_27c) | uStack_4c & uVar66;
      local_138 = ZEXT816(0);
      local_128[0] = local_188;
      local_128[1] = fStack_184;
      local_128[2] = fStack_180;
      local_128[3] = fStack_17c;
      local_118[0] = ~uVar60 & (uint)((local_68 +
                                      (fVar96 + local_1a8 * (float)local_48._0_4_) * local_e8) -
                                     local_88 * local_288) |
                     ((uint)fVar40 & uVar32 | ~uVar32 & (uint)local_98) & uVar60;
      local_118[1] = ~uVar62 & (uint)((fStack_64 +
                                      (fVar100 + fStack_1a4 * (float)local_48._4_4_) * fStack_e4) -
                                     fStack_84 * fStack_284) |
                     ((uint)fVar43 & uVar33 | ~uVar33 & (uint)fStack_94) & uVar62;
      local_118[2] = ~uVar64 & (uint)((fStack_60 + (fVar103 + fStack_1a0 * fStack_40) * fStack_e0) -
                                     fStack_80 * fStack_280) |
                     ((uint)fVar44 & uVar34 | ~uVar34 & (uint)fStack_90) & uVar64;
      local_118[3] = ~uVar66 & (uint)((fStack_5c + (fVar107 + fStack_19c * fStack_3c) * fStack_dc) -
                                     fStack_7c * fStack_27c) |
                     ((uint)fVar45 & uVar95 | ~uVar95 & (uint)fStack_8c) & uVar66;
      local_108[0] = ~uVar60 & (uint)((local_198 +
                                      (fVar139 + local_2f8 * (float)local_48._0_4_) * local_e8) -
                                     local_78 * local_288) |
                     ((uint)fVar47 & uVar32 | ~uVar32 & (uint)local_a8) & uVar60;
      local_108[1] = ~uVar62 & (uint)((fStack_194 +
                                      (fVar141 + fStack_2f4 * (float)local_48._4_4_) * fStack_e4) -
                                     fStack_74 * fStack_284) |
                     ((uint)fVar54 & uVar33 | ~uVar33 & (uint)fStack_a4) & uVar62;
      local_108[2] = ~uVar64 & (uint)((fStack_190 + (fVar142 + fStack_2f0 * fStack_40) * fStack_e0)
                                     - fStack_70 * fStack_280) |
                     ((uint)fVar56 & uVar34 | ~uVar34 & (uint)fStack_a0) & uVar64;
      local_108[3] = ~uVar66 & (uint)((fStack_18c + (fVar143 + fStack_2ec * fStack_3c) * fStack_dc)
                                     - fStack_6c * fStack_27c) |
                     ((uint)fVar58 & uVar95 | ~uVar95 & (uint)fStack_9c) & uVar66;
      local_f8[0] = ~uVar60 & (uint)((local_2c8 +
                                     (fVar97 + local_158 * (float)local_48._0_4_) * local_e8) -
                                    local_168 * local_288) |
                    (~uVar32 & local_318._0_4_ | (uint)fVar112 & uVar32) & uVar60;
      local_f8[1] = ~uVar62 & (uint)((fStack_2c4 +
                                     (fVar101 + fStack_154 * (float)local_48._4_4_) * fStack_e4) -
                                    fStack_164 * fStack_284) |
                    (~uVar33 & local_318._4_4_ | (uint)fVar117 & uVar33) & uVar62;
      local_f8[2] = ~uVar64 & (uint)((fStack_2c0 + (fVar104 + fStack_150 * fStack_40) * fStack_e0) -
                                    fStack_160 * fStack_280) |
                    (~uVar34 & local_318._8_4_ | (uint)fVar121 & uVar34) & uVar64;
      local_f8[3] = ~uVar66 & (uint)((fStack_2bc + (fVar108 + fStack_14c * fStack_3c) * fStack_dc) -
                                    fStack_15c * fStack_27c) |
                    (~uVar95 & (uint)fStack_30c | (uint)fVar125 & uVar95) & uVar66;
      pSVar26 = pRVar29->scene;
      uVar30 = (ulong)(uVar31 & 0xff);
      do {
        local_268.hit = (RTCHitN *)&local_2b8;
        local_268.valid = &local_31c;
        uVar18 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        local_2a0 = local_c8[uVar18];
        pGVar15 = (pSVar26->geometries).items[local_2a0].ptr;
        if ((pGVar15->mask & ray->mask) != 0) {
          if ((pRVar29->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar23 = 1, pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_003469b5;
          local_2ac = local_148[uVar18];
          local_2a8 = local_128[uVar18 - 4];
          local_2a4 = (local_1d8->primIDs).field_0.i[uVar18];
          local_2b8 = local_118[uVar18];
          local_2b4 = local_108[uVar18];
          local_2b0 = local_f8[uVar18];
          local_29c = pRVar29->user->instID[0];
          local_298 = pRVar29->user->instPrimID[0];
          local_318._0_4_ = ray->tfar;
          ray->tfar = local_128[uVar18];
          local_31c = -1;
          local_268.geometryUserPtr = pGVar15->userPtr;
          local_268.context = pRVar29->user;
          local_268.N = 1;
          local_268.ray = (RTCRayN *)ray;
          if ((pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar15->occlusionFilterN)(&local_268), pRVar29 = local_300, *local_268.valid != 0))
          {
            p_Var22 = pRVar29->args->filter;
            if ((p_Var22 == (RTCFilterFunctionN)0x0) ||
               ((((pRVar29->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar15->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var22)(&local_268), *local_268.valid != 0)))) {
              bVar23 = 1;
              goto LAB_003469b5;
            }
          }
          ray->tfar = (float)local_318._0_4_;
          pRVar29 = local_300;
        }
        uVar30 = uVar30 ^ 1L << (uVar18 & 0x3f);
        if (uVar30 == 0) {
          bVar23 = 0;
LAB_003469b5:
          return (bool)(bVar27 | bVar23);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time());
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }